

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O3

int __thiscall CShInstruction::getImmediateBits(CShInstruction *this,ShImmediateType type)

{
  int iVar1;
  
  iVar1 = 0;
  if (type - Immediate4 < 3) {
    iVar1 = type * 4;
  }
  return iVar1;
}

Assistant:

int CShInstruction::getImmediateBits(ShImmediateType type)
{
	switch (type)
	{
	case ShImmediateType::Immediate4:
		return 4;
	case ShImmediateType::Immediate8:
		return 8;
	case ShImmediateType::Immediate12:
		return 12;
	default:
		return 0;
	}
}